

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void adjustlocalvars(LexState *ls,int nvars)

{
  int iVar1;
  FuncState *fs_00;
  LocVar *pLVar2;
  FuncState *fs;
  int nvars_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  fs_00->nactvar = fs_00->nactvar + (char)nvars;
  for (fs._4_4_ = nvars; fs._4_4_ != 0; fs._4_4_ = fs._4_4_ + -1) {
    iVar1 = fs_00->pc;
    pLVar2 = getlocvar(fs_00,(uint)fs_00->nactvar - fs._4_4_);
    pLVar2->startpc = iVar1;
  }
  if ((ravi_parser_debug & 4U) != 0) {
    raviY_printf(fs_00,"adjustlocalvars -> set fs->nactvar to %d\n",(ulong)fs_00->nactvar);
  }
  return;
}

Assistant:

static void adjustlocalvars (LexState *ls, int nvars) {
  FuncState *fs = ls->fs;
  fs->nactvar = cast_byte(fs->nactvar + nvars);
  for (; nvars; nvars--) {
    getlocvar(fs, fs->nactvar - nvars)->startpc = fs->pc;
  }
  DEBUG_VARS(raviY_printf(fs, "adjustlocalvars -> set fs->nactvar to %d\n", fs->nactvar));
}